

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::set_allocated_shaperange
          (ArrayFeatureType *this,ArrayFeatureType_ShapeRange *shaperange)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  ArrayFeatureType_ShapeRange *shaperange_local;
  ArrayFeatureType *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_ShapeFlexibility(this);
  if (shaperange != (ArrayFeatureType_ShapeRange *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<CoreML::Specification::ArrayFeatureType_ShapeRange>
         ::GetOwningArena(shaperange);
    message_arena = (Arena *)shaperange;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>
                              (message_arena_00,shaperange,submessage_arena_00);
    }
    set_has_shaperange(this);
    (this->ShapeFlexibility_).enumeratedshapes_ = (ArrayFeatureType_EnumeratedShapes *)message_arena
    ;
  }
  return;
}

Assistant:

void ArrayFeatureType::set_allocated_shaperange(::CoreML::Specification::ArrayFeatureType_ShapeRange* shaperange) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_ShapeFlexibility();
  if (shaperange) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::ArrayFeatureType_ShapeRange>::GetOwningArena(shaperange);
    if (message_arena != submessage_arena) {
      shaperange = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, shaperange, submessage_arena);
    }
    set_has_shaperange();
    ShapeFlexibility_.shaperange_ = shaperange;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.ArrayFeatureType.shapeRange)
}